

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O0

void __thiscall xray_re::xr_way_object::save_v12(xr_way_object *this,xr_ini_writer *w)

{
  undefined8 this_00;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  void *__buf;
  size_t in_RCX;
  void *__buf_00;
  int n;
  pair<unsigned_short,_unsigned_char> local_11c;
  _Self local_118 [3];
  _Self local_100;
  iterator pair;
  way_link *link;
  const_iterator cStack_e8;
  uint8_t id;
  way_link_vec_cit end;
  way_link_vec_cit it;
  fvector2 link_vector;
  dict indices;
  char *buf;
  char buffer [128];
  xr_ini_writer *w_local;
  xr_way_object *this_local;
  
  buffer._120_8_ = w;
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  std::
  map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  ::map((map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
         *)&link_vector);
  end._M_current =
       (way_link *)
       std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>::begin(&this->m_links);
  cStack_e8 = std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>::end
                        (&this->m_links);
  link._7_1_ = 0;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&stack0xffffffffffffff18);
    if (!bVar1) break;
    pair._M_node = (_Base_ptr)
                   __gnu_cxx::
                   __normal_iterator<const_xray_re::way_link_*,_std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>_>
                   ::operator*(&end);
    local_100._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
         ::find((map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
                 *)&link_vector,(key_type_conflict1 *)pair._M_node);
    local_118[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
         ::end((map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
                *)&link_vector);
    bVar1 = std::operator!=(&local_100,local_118);
    if (bVar1) {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_unsigned_char>_>::operator->
                         (&local_100);
      link._7_1_ = ppVar3->second + 1;
      ppVar3->second = link._7_1_;
    }
    else {
      link._7_1_ = 0;
      std::pair<unsigned_short,_unsigned_char>::pair<unsigned_short_&,_unsigned_char_&,_true>
                (&local_11c,(unsigned_short *)pair._M_node,(uchar *)((long)&link + 7));
      std::
      map<unsigned_short,unsigned_char,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_char>>>
      ::insert<std::pair<unsigned_short,unsigned_char>>
                ((map<unsigned_short,unsigned_char,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_char>>>
                  *)&link_vector,&local_11c);
    }
    in_RCX = (size_t)(ushort)(short)(pair._M_node)->_M_color;
    iVar2 = snprintf((char *)&buf,0x80,"link_wp_%d_%d",in_RCX,(ulong)link._7_1_);
    if (0 < iVar2) {
      xr_ini_writer::write((xr_ini_writer *)buffer._120_8_,(int)&buf,__buf_00,in_RCX);
    }
    __gnu_cxx::
    __normal_iterator<const_xray_re::way_link_*,_std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>_>
    ::operator++(&end);
  }
  xr_ini_writer::write((xr_ini_writer *)buffer._120_8_,0x2e38e3,(void *)(ulong)this->m_type,in_RCX);
  xr_ini_writer::write((xr_ini_writer *)buffer._120_8_,0x2e4e39,(void *)0x13,in_RCX);
  xr_ini_writer::
  w_ini_seq<std::vector<xray_re::way_point_le,std::allocator<xray_re::way_point_le>>,write_point_ini>
            ((xr_ini_writer *)buffer._120_8_,&this->m_points);
  this_00 = buffer._120_8_;
  __buf = (void *)std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>::size
                            (&this->m_points);
  xr_ini_writer::write((xr_ini_writer *)this_00,0x2e4069,__buf,in_RCX);
  std::
  map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  ::~map((map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
          *)&link_vector);
  return;
}

Assistant:

void xr_way_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	// write links
	char buffer[128];
	char* buf = &buffer[0];
	typedef std::map<uint16_t, uint8_t> dict;
	typedef std::pair<uint16_t, uint8_t> dict_pair;
	dict indices;
	fvector2 link_vector;
	link_vector.y = 1.0;

	way_link_vec_cit it = m_links.begin(), end = m_links.end();
	for (uint8_t id = 0; it != end; ++it) {
		way_link* link = (way_link *)&(*it);

		dict::iterator pair = indices.find(link->from);
		if (pair != indices.end())
			id = ++pair->second;
		else
			indices.insert(dict_pair(link->from, id = 0));

		int n = xr_snprintf(buf, sizeof(buffer), "link_wp_%d_%d", link->from, id);
		if (n > 0)
		{
			link_vector.x = link->to;
			link_vector.y = link->weight;
			w->write(buf, link_vector);
		}
	}

	w->write("type", this->m_type);
	w->write("version", WAYOBJECT_VERSION);

	// write waypoints

	w->w_ini_seq(this->m_points, write_point_ini());
	w->write("wp_count", this->m_points.size());
}